

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffgeom2pose-test.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *this;
  long in_RSI;
  int in_EDI;
  char *in_stack_00002508;
  char *in_stack_00002510;
  
  if (in_EDI == 1) {
    test_run(in_stack_00002510,in_stack_00002508);
    return 0;
  }
  if (in_EDI == 2) {
    iVar1 = strcmp(*(char **)(in_RSI + 8),"double");
    if (iVar1 == 0) {
      test_run(in_stack_00002510,in_stack_00002508);
      return 0;
    }
    iVar1 = strcmp(*(char **)(in_RSI + 8),"float");
    if (iVar1 == 0) {
      test_run(in_stack_00002510,in_stack_00002508);
      return 0;
    }
    iVar1 = strcmp(*(char **)(in_RSI + 8),"-benchmark");
    if (iVar1 == 0) {
      test_run(in_stack_00002510,in_stack_00002508);
      return 0;
    }
  }
  else if (in_EDI == 3) {
    iVar1 = strcmp(*(char **)(in_RSI + 8),"double");
    if ((iVar1 == 0) && (iVar1 = strcmp(*(char **)(in_RSI + 0x10),"-benchmark"), iVar1 == 0)) {
      test_run(in_stack_00002510,in_stack_00002508);
    }
    else {
      iVar1 = strcmp(*(char **)(in_RSI + 8),"float");
      if ((iVar1 != 0) || (iVar1 = strcmp(*(char **)(in_RSI + 0x10),"-benchmark"), iVar1 != 0))
      goto LAB_001019a4;
      test_run(in_stack_00002510,in_stack_00002508);
    }
    return 0;
  }
LAB_001019a4:
  this = std::operator<<((ostream *)&std::cout,
                         "usage: ./cmd [-benchmark]\n       ./cmd [double | float] [-benchmark]");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return 1;
}

Assistant:

int main(int argc, const char* argv[])
{
	switch (argc) {
	case 1:
		test_run("double");
		return 0;
	case 2:
		if      (strcmp(argv[1], "double")     == 0) test_run("double");
		else if (strcmp(argv[1], "float")      == 0) test_run("float");
		else if (strcmp(argv[1], "-benchmark") == 0) test_run("double", "benchmark");
		else break;
		return 0;
	case 3:
		if      ((strcmp(argv[1], "double") == 0) && (strcmp(argv[2], "-benchmark") == 0))
			test_run("double", "benchmark");
		else if ((strcmp(argv[1], "float")  == 0) && (strcmp(argv[2], "-benchmark") == 0))
			test_run("float", "benchmark");
		else break;
		return 0;
	}
	std::cout << "usage: ./cmd [-benchmark]\n"
				 "       ./cmd [double | float] [-benchmark]" << std::endl;
    return 1;
}